

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> * __thiscall
djb::brdf::eval_batch
          (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           *__return_storage_ptr__,brdf *this,
          vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
          *io,void *user_args)

{
  pointer pvVar1;
  void *pvVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 local_48;
  undefined8 uStack_40;
  void *local_38;
  
  local_38 = user_args;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (__return_storage_ptr__,
             ((long)(io->
                    super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(io->
                    super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_48);
  ppVar3 = (io->
           super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(io->
                              super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3) *
          -0x55555555) {
    lVar5 = 0xc;
    lVar6 = 8;
    lVar4 = 0;
    do {
      (**this->_vptr_brdf)
                (&local_48,this,(long)ppVar3 + lVar5 + -0xc,(long)&(ppVar3->first).x + lVar5,
                 local_38);
      pvVar1 = (__return_storage_ptr__->
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pvVar2 = *(void **)((long)&pvVar1->_M_size + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
      *(undefined8 *)((long)pvVar1 + lVar6 + -8) = local_48;
      *(undefined8 *)((long)&pvVar1->_M_size + lVar6) = uStack_40;
      local_48 = 0;
      uStack_40 = 0;
      operator_delete((void *)0x0);
      lVar4 = lVar4 + 1;
      ppVar3 = (io->
               super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x18;
      lVar6 = lVar6 + 0x10;
    } while (lVar4 < (int)((ulong)((long)(io->
                                         super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3)
                          >> 3) * -0x55555555);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<brdf::value_type>
brdf::eval_batch(
	const std::vector<brdf::io_pair> &io,
	const void *user_args
) const {
	std::vector<brdf::value_type> fr(io.size());

	for (int i = 0; i < (int)io.size(); ++i) {
		fr[i] = eval(io[i].first, io[i].second, user_args);
	}

	return fr;
}